

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_fs_event_ref(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_event_t h;
  uv_stream_t uStack_3c0;
  uv_loop_t *puStack_2e8;
  long lStack_2d8;
  long lStack_2d0;
  uv_stream_t uStack_2c8;
  uv_loop_t *puStack_1f0;
  long lStack_1e0;
  long lStack_1d8;
  uv_tcp_t uStack_1d0;
  uv_loop_t *puStack_f8;
  long lStack_e8;
  long lStack_e0;
  uv_fs_poll_t uStack_d8;
  uv_loop_t *puStack_90;
  long local_80;
  long local_78;
  uv_fs_event_t local_70;
  
  puStack_90 = (uv_loop_t *)0x1b572a;
  puVar2 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x1b573a;
  uv_fs_event_init(puVar2,&local_70);
  puStack_90 = (uv_loop_t *)0x1b5752;
  uv_fs_event_start(&local_70,fail_cb,".",0);
  puStack_90 = (uv_loop_t *)0x1b575a;
  uv_unref((uv_handle_t *)&local_70);
  puStack_90 = (uv_loop_t *)0x1b575f;
  puVar2 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x1b5769;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_90 = (uv_loop_t *)0x1b5771;
  do_close(&local_70);
  puStack_90 = (uv_loop_t *)0x1b5776;
  puVar2 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x1b578a;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_90 = (uv_loop_t *)0x1b5794;
  uv_run(puVar2,UV_RUN_DEFAULT);
  local_78 = 0;
  puStack_90 = (uv_loop_t *)0x1b57a2;
  puVar3 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x1b57aa;
  iVar1 = uv_loop_close(puVar3);
  local_80 = (long)iVar1;
  if (local_78 == local_80) {
    puStack_90 = (uv_loop_t *)0x1b57c2;
    uv_library_shutdown();
    return 0;
  }
  puStack_90 = (uv_loop_t *)run_test_fs_poll_ref;
  run_test_fs_event_ref_cold_1();
  puStack_f8 = (uv_loop_t *)0x1b57e6;
  puStack_90 = puVar2;
  puVar2 = uv_default_loop();
  puStack_f8 = (uv_loop_t *)0x1b57f6;
  uv_fs_poll_init(puVar2,&uStack_d8);
  puStack_f8 = (uv_loop_t *)0x1b580c;
  uv_fs_poll_start(&uStack_d8,(uv_fs_poll_cb)0x0,".",999);
  puStack_f8 = (uv_loop_t *)0x1b5814;
  uv_unref((uv_handle_t *)&uStack_d8);
  puStack_f8 = (uv_loop_t *)0x1b5819;
  puVar2 = uv_default_loop();
  puStack_f8 = (uv_loop_t *)0x1b5823;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_f8 = (uv_loop_t *)0x1b582b;
  do_close(&uStack_d8);
  puStack_f8 = (uv_loop_t *)0x1b5830;
  puVar2 = uv_default_loop();
  puStack_f8 = (uv_loop_t *)0x1b5844;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_f8 = (uv_loop_t *)0x1b584e;
  uv_run(puVar2,UV_RUN_DEFAULT);
  lStack_e0 = 0;
  puStack_f8 = (uv_loop_t *)0x1b585c;
  puVar3 = uv_default_loop();
  puStack_f8 = (uv_loop_t *)0x1b5864;
  iVar1 = uv_loop_close(puVar3);
  lStack_e8 = (long)iVar1;
  if (lStack_e0 == lStack_e8) {
    puStack_f8 = (uv_loop_t *)0x1b587c;
    uv_library_shutdown();
    return 0;
  }
  puStack_f8 = (uv_loop_t *)run_test_tcp_ref;
  run_test_fs_poll_ref_cold_1();
  puStack_1f0 = (uv_loop_t *)0x1b58a0;
  puStack_f8 = puVar2;
  puVar2 = uv_default_loop();
  puStack_1f0 = (uv_loop_t *)0x1b58b0;
  uv_tcp_init(puVar2,&uStack_1d0);
  puStack_1f0 = (uv_loop_t *)0x1b58b8;
  uv_unref((uv_handle_t *)&uStack_1d0);
  puStack_1f0 = (uv_loop_t *)0x1b58bd;
  puVar2 = uv_default_loop();
  puStack_1f0 = (uv_loop_t *)0x1b58c7;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_1f0 = (uv_loop_t *)0x1b58cf;
  do_close(&uStack_1d0);
  puStack_1f0 = (uv_loop_t *)0x1b58d4;
  puVar2 = uv_default_loop();
  puStack_1f0 = (uv_loop_t *)0x1b58e8;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_1f0 = (uv_loop_t *)0x1b58f2;
  uv_run(puVar2,UV_RUN_DEFAULT);
  lStack_1d8 = 0;
  puStack_1f0 = (uv_loop_t *)0x1b5900;
  puVar3 = uv_default_loop();
  puStack_1f0 = (uv_loop_t *)0x1b5908;
  iVar1 = uv_loop_close(puVar3);
  lStack_1e0 = (long)iVar1;
  if (lStack_1d8 == lStack_1e0) {
    puStack_1f0 = (uv_loop_t *)0x1b5920;
    uv_library_shutdown();
    return 0;
  }
  puStack_1f0 = (uv_loop_t *)run_test_tcp_ref2;
  run_test_tcp_ref_cold_1();
  puStack_2e8 = (uv_loop_t *)0x1b5947;
  puStack_1f0 = puVar2;
  puVar2 = uv_default_loop();
  puStack_2e8 = (uv_loop_t *)0x1b5957;
  uv_tcp_init(puVar2,(uv_tcp_t *)&uStack_2c8);
  puStack_2e8 = (uv_loop_t *)0x1b596b;
  uv_listen(&uStack_2c8,0x80,fail_cb);
  puStack_2e8 = (uv_loop_t *)0x1b5973;
  uv_unref((uv_handle_t *)&uStack_2c8);
  puStack_2e8 = (uv_loop_t *)0x1b5978;
  puVar2 = uv_default_loop();
  puStack_2e8 = (uv_loop_t *)0x1b5982;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_2e8 = (uv_loop_t *)0x1b598a;
  do_close(&uStack_2c8);
  puStack_2e8 = (uv_loop_t *)0x1b598f;
  puVar2 = uv_default_loop();
  puStack_2e8 = (uv_loop_t *)0x1b59a3;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_2e8 = (uv_loop_t *)0x1b59ad;
  uv_run(puVar2,UV_RUN_DEFAULT);
  lStack_2d0 = 0;
  puStack_2e8 = (uv_loop_t *)0x1b59bb;
  puVar3 = uv_default_loop();
  puStack_2e8 = (uv_loop_t *)0x1b59c3;
  iVar1 = uv_loop_close(puVar3);
  lStack_2d8 = (long)iVar1;
  if (lStack_2d0 == lStack_2d8) {
    puStack_2e8 = (uv_loop_t *)0x1b59db;
    uv_library_shutdown();
    return 0;
  }
  puStack_2e8 = (uv_loop_t *)run_test_tcp_ref2b;
  run_test_tcp_ref2_cold_1();
  puStack_2e8 = puVar2;
  puVar2 = uv_default_loop();
  uv_tcp_init(puVar2,(uv_tcp_t *)&uStack_3c0);
  uv_listen(&uStack_3c0,0x80,fail_cb);
  uv_unref((uv_handle_t *)&uStack_3c0);
  uv_close((uv_handle_t *)&uStack_3c0,close_cb);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (close_cb_called == 1) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_ref2b_cold_1();
  }
  run_test_tcp_ref2b_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_ref) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_fs_event_t h;
  uv_fs_event_init(uv_default_loop(), &h);
  uv_fs_event_start(&h, (uv_fs_event_cb)fail_cb, ".", 0);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}